

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::ScrollArea::ensureWidgetVisible
          (ScrollArea *this,QWidget *childWidget,int xmargin,int ymargin)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QWidget *pQVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  QPoint local_120;
  QPoint local_118;
  QPoint local_110;
  int local_108;
  int local_104;
  int posY;
  int posX;
  QPoint local_f8;
  QPoint local_f0;
  undefined1 local_e8 [8];
  QRect visibleRect;
  QPoint local_d0;
  QPoint local_c8;
  QSize local_c0;
  QPoint local_b8;
  QPoint local_b0;
  undefined1 local_a8 [8];
  QRect focusRect;
  undefined1 local_74 [8];
  QRect defaultMicroFocus;
  QVariant local_58;
  undefined1 local_38 [8];
  QRect microFocus;
  ScrollAreaPrivate *d;
  int ymargin_local;
  int xmargin_local;
  QWidget *childWidget_local;
  ScrollArea *this_local;
  
  microFocus._8_8_ = d_func(this);
  pQVar4 = QPointer<QWidget>::operator->(&((ScrollAreaPrivate *)microFocus._8_8_)->widget);
  uVar5 = QWidget::isAncestorOf(pQVar4);
  if ((uVar5 & 1) != 0) {
    (**(code **)(*(long *)childWidget + 400))(&local_58,childWidget,2);
    auVar6 = QVariant::toRect();
    microFocus._0_8_ = auVar6._8_8_;
    local_38 = auVar6._0_8_;
    QVariant::~QVariant(&local_58);
    QWidget::inputMethodQuery((int)&focusRect + ImCursorPosition);
    auVar6 = QVariant::toRect();
    defaultMicroFocus._0_8_ = auVar6._8_8_;
    local_74 = auVar6._0_8_;
    QVariant::~QVariant((QVariant *)&focusRect.x2);
    bVar1 = ::operator!=((QRect *)local_38,(QRect *)local_74);
    if (bVar1) {
      pQVar4 = QPointer::operator_cast_to_QWidget_((QPointer *)(microFocus._8_8_ + 0xa8));
      local_b8 = QRect::topLeft((QRect *)local_38);
      local_b0 = (QPoint)QWidget::mapTo(childWidget,(QPoint *)pQVar4);
      local_c0 = QRect::size((QRect *)local_38);
      QRect::QRect((QRect *)local_a8,&local_b0,&local_c0);
    }
    else {
      pQVar4 = QPointer::operator_cast_to_QWidget_((QPointer *)(microFocus._8_8_ + 0xa8));
      QPoint::QPoint(&local_d0,0,0);
      local_c8 = (QPoint)QWidget::mapTo(childWidget,(QPoint *)pQVar4);
      visibleRect._8_8_ = QWidget::size(childWidget);
      QRect::QRect((QRect *)local_a8,&local_c8,(QSize *)&visibleRect.x2);
    }
    QPointer<QWidget>::operator->((QPointer<QWidget> *)(microFocus._8_8_ + 0xa8));
    local_f8 = (QPoint)QWidget::pos();
    local_f0 = operator-(&local_f8);
    _posY = QWidget::size(*(QWidget **)(microFocus._8_8_ + 0x20));
    QRect::QRect((QRect *)local_e8,&local_f0,(QSize *)&posY);
    uVar5 = QRect::contains((QRect *)local_e8,SUB81(local_a8,0));
    if ((uVar5 & 1) == 0) {
      QRect::adjust((QRect *)local_a8,-xmargin,-ymargin,xmargin,ymargin);
      local_104 = 0;
      local_108 = 0;
      iVar2 = QRect::width((QRect *)local_a8);
      iVar3 = QRect::width((QRect *)local_e8);
      if (iVar3 < iVar2) {
        local_110 = QRect::center((QRect *)local_a8);
        iVar2 = QPoint::x(&local_110);
        iVar3 = QWidget::width(*(QWidget **)(microFocus._8_8_ + 0x20));
        local_104 = iVar2 - iVar3 / 2;
      }
      else {
        iVar2 = QRect::right((QRect *)local_a8);
        iVar3 = QRect::right((QRect *)local_e8);
        if (iVar3 < iVar2) {
          iVar2 = QRect::right((QRect *)local_a8);
          local_104 = QWidget::width(*(QWidget **)(microFocus._8_8_ + 0x20));
          local_104 = iVar2 - local_104;
        }
        else {
          iVar2 = QRect::left((QRect *)local_a8);
          iVar3 = QRect::left((QRect *)local_e8);
          if (iVar2 < iVar3) {
            local_104 = QRect::left((QRect *)local_a8);
          }
        }
      }
      iVar2 = QRect::height((QRect *)local_a8);
      iVar3 = QRect::height((QRect *)local_e8);
      if (iVar3 < iVar2) {
        local_118 = QRect::center((QRect *)local_a8);
        iVar2 = QPoint::y(&local_118);
        iVar3 = QWidget::height(*(QWidget **)(microFocus._8_8_ + 0x20));
        local_108 = iVar2 - iVar3 / 2;
      }
      else {
        iVar2 = QRect::bottom((QRect *)local_a8);
        iVar3 = QRect::bottom((QRect *)local_e8);
        if (iVar3 < iVar2) {
          iVar2 = QRect::bottom((QRect *)local_a8);
          local_108 = QWidget::height(*(QWidget **)(microFocus._8_8_ + 0x20));
          local_108 = iVar2 - local_108;
        }
        else {
          iVar2 = QRect::top((QRect *)local_a8);
          iVar3 = QRect::top((QRect *)local_e8);
          if (iVar2 < iVar3) {
            local_108 = QRect::top((QRect *)local_a8);
          }
        }
      }
      QPoint::QPoint(&local_120,local_104,local_108);
      AbstractScrollArea::setTopLeftPointShownArea(&this->super_AbstractScrollArea,&local_120);
    }
  }
  return;
}

Assistant:

void
ScrollArea::ensureWidgetVisible( QWidget * childWidget,
	int xmargin, int ymargin )
{
	ScrollAreaPrivate * d = d_func();

	if( !d->widget->isAncestorOf( childWidget ) )
		return;

	const QRect microFocus =
		childWidget->inputMethodQuery( Qt::ImCursorRectangle ).toRect();
	const QRect defaultMicroFocus =
		childWidget->QWidget::inputMethodQuery( Qt::ImCursorRectangle ).toRect();
	QRect focusRect = ( microFocus != defaultMicroFocus )
		? QRect( childWidget->mapTo( d->widget, microFocus.topLeft() ), microFocus.size() )
		: QRect( childWidget->mapTo( d->widget, QPoint( 0,0 ) ), childWidget->size() );
	const QRect visibleRect( -d->widget->pos(), d->viewport->size() );

	if( visibleRect.contains( focusRect ) )
		return;

	focusRect.adjust( -xmargin, -ymargin, xmargin, ymargin );

	int posX = 0;
	int posY = 0;

	if( focusRect.width() > visibleRect.width() )
		posX = focusRect.center().x() - d->viewport->width() / 2;
	else if( focusRect.right() > visibleRect.right() )
		posX = focusRect.right() - d->viewport->width();
	else if( focusRect.left() < visibleRect.left() )
		posX = focusRect.left();

	if( focusRect.height() > visibleRect.height() )
		posY = focusRect.center().y() - d->viewport->height() / 2;
	else if( focusRect.bottom() > visibleRect.bottom() )
		posY = focusRect.bottom() - d->viewport->height();
	else if( focusRect.top() < visibleRect.top() )
		posY = focusRect.top();

	setTopLeftPointShownArea( QPoint( posX, posY ) );
}